

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsreada(bstring r,bStream *s,int n)

{
  uint uVar1;
  bstring ptVar2;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  tagbstring x;
  tagbstring local_40;
  
  iVar7 = -1;
  if ((((s != (bStream *)0x0) && (ptVar2 = s->buff, r != (bstring)0x0 && ptVar2 != (bstring)0x0)) &&
      (0 < r->mlen)) && ((uVar1 = r->slen, -1 < (int)uVar1 && (0 < n && uVar1 <= (uint)r->mlen)))) {
    iVar5 = ptVar2->slen;
    iVar4 = balloc(ptVar2,s->maxBuffSz + 1);
    if (iVar4 == 0) {
      iVar7 = uVar1 + n;
      puVar3 = s->buff->data;
      local_40.data = puVar3;
      do {
        if (iVar7 <= r->slen + iVar5) {
          local_40.slen = iVar7 - r->slen;
          iVar7 = bconcat(r,&local_40);
          ptVar2 = s->buff;
          ptVar2->slen = iVar5;
          if (iVar7 == 0) {
            bdelete(ptVar2,0,local_40.slen);
          }
          goto LAB_001134f1;
        }
        local_40.slen = iVar5;
        iVar4 = bconcat(r,&local_40);
        if (iVar4 != 0) {
          if (0 < iVar5) goto LAB_001134eb;
          break;
        }
        iVar5 = iVar7 - r->slen;
        if (s->maxBuffSz <= iVar5) {
          iVar5 = s->maxBuffSz;
        }
        sVar6 = (*s->readFnPtr)(puVar3,1,(long)iVar5,s->parm);
        iVar5 = (int)sVar6;
      } while (0 < iVar5);
      iVar5 = 0;
      s->isEOF = 1;
LAB_001134eb:
      s->buff->slen = iVar5;
LAB_001134f1:
      iVar7 = -(uint)(r->slen == 0);
    }
  }
  return iVar7;
}

Assistant:

int bsreada (bstring r, struct bStream * s, int n) {
int l, ret;
char * b;
struct tagbstring x;

	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0
	 || r->slen < 0 || r->mlen < r->slen || n <= 0) return BSTR_ERR;

	n += r->slen;
	if (n <= 0) return BSTR_ERR;

	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (char *) s->buff->data;
	x.data = (unsigned char *) b;

	do {
		if (l + r->slen >= n) {
			x.slen = n - r->slen;
			ret = bconcat (r, &x);
			s->buff->slen = l;
			if (BSTR_OK == ret) bdelete (s->buff, 0, x.slen);
			return BSTR_ERR & -(r->slen == 0);
		}

		x.slen = l;
		if (BSTR_OK != bconcat (r, &x)) break;

		l = n - r->slen;
		if (l > s->maxBuffSz) l = s->maxBuffSz;

		l = (int) s->readFnPtr (b, 1, l, s->parm);

	} while (l > 0);
	if (l < 0) l = 0;
	if (l == 0) s->isEOF = 1;
	s->buff->slen = l;
	return BSTR_ERR & -(r->slen == 0);
}